

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<no_ansi_port_decl::MainVisitor,_true,_false,_false,_false>::
visit<slang::ast::PackedUnionType>
          (ASTVisitor<no_ansi_port_decl::MainVisitor,_true,_false,_false,_false> *this,
          PackedUnionType *t)

{
  PackedUnionType *in_stack_00000018;
  ASTVisitor<no_ansi_port_decl::MainVisitor,_true,_false,_false,_false> *in_stack_00000020;
  
  visitDefault<slang::ast::PackedUnionType>(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }